

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

double pbrt::parseNumber(Token *t)

{
  char *pcVar1;
  byte bVar2;
  byte *args;
  size_t sVar3;
  size_t __n;
  char *__src;
  int iVar4;
  char *__s;
  long lVar5;
  size_t sVar6;
  ulong __n_00;
  char *pcVar7;
  long in_FS_OFFSET;
  bool bVar8;
  float fVar9;
  int length;
  char *endptr;
  char buf [64];
  int local_94;
  double local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  char local_68 [64];
  
  if ((t->token)._M_len == 1) {
    args = (byte *)(t->token)._M_str;
    bVar2 = *args;
    if (9 < (byte)(bVar2 - 0x30)) {
      ErrorExit<char_const&>(&t->loc,"\"%c\": expected a number",(char *)args);
    }
    local_90 = (double)(int)(bVar2 - 0x30);
  }
  else {
    if (parseNumber(pbrt::Token_const&)::reg == '\0') {
      iVar4 = __cxa_guard_acquire(&parseNumber(pbrt::Token_const&)::reg);
      if (iVar4 != 0) {
        StatRegisterer::StatRegisterer
                  ((StatRegisterer *)&parseNumber(pbrt::Token_const&)::reg,
                   parseNumber(pbrt::Token_const&)::$_0::__invoke(pbrt::StatsAccumulator__,
                   (PixelAccumFunc)0x0);
        __cxa_guard_release(&parseNumber(pbrt::Token_const&)::reg);
      }
    }
    *(long *)(in_FS_OFFSET + -0x4b8) = *(long *)(in_FS_OFFSET + -0x4b8) + 1;
    sVar3 = (t->token)._M_len;
    if (sVar3 - 0x3f < 0xffffffffffffffc0) {
      *(long *)(in_FS_OFFSET + -0x4c0) = *(long *)(in_FS_OFFSET + -0x4c0) + 1;
      __n_00 = sVar3 + 1;
      __s = (char *)operator_new__(__n_00);
      memset(__s,0,__n_00);
      pcVar7 = __s;
    }
    else {
      pcVar7 = local_68;
      __s = (char *)0x0;
    }
    __n = (t->token)._M_len;
    __src = (t->token)._M_str;
    if (__n != 0) {
      memmove(pcVar7,__src,__n);
    }
    pcVar7[__n] = '\0';
    local_94 = 0;
    bVar8 = __n == 0;
    if ((!bVar8) && ((byte)(*__src - 0x30U) < 10)) {
      sVar6 = 1;
      do {
        bVar8 = __n == sVar6;
        if (bVar8) break;
        pcVar1 = __src + sVar6;
        sVar6 = sVar6 + 1;
      } while ((byte)(*pcVar1 - 0x30U) < 10);
    }
    if (bVar8) {
      lVar5 = strtol(pcVar7,(char **)&local_88,10);
      local_90 = (double)lVar5;
      local_94 = (int)local_88._M_dataplus._M_p - (int)pcVar7;
    }
    else {
      fVar9 = double_conversion::StringToDoubleConverter::StringToFloat
                        ((StringToDoubleConverter *)floatParser,pcVar7,(int)__n,&local_94);
      local_90 = (double)fVar9;
    }
    if (local_94 == 0) {
      pcVar7 = (t->token)._M_str;
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,pcVar7,pcVar7 + (t->token)._M_len);
      ErrorExit<std::__cxx11::string>(&t->loc,"%s: expected a number",&local_88);
    }
    if (__s != (char *)0x0) {
      operator_delete__(__s);
    }
  }
  return local_90;
}

Assistant:

static double parseNumber(const Token &t) {
    // Fast path for a single digit
    if (t.token.size() == 1) {
        if (!(t.token[0] >= '0' && t.token[0] <= '9'))
            ErrorExit(&t.loc, "\"%c\": expected a number", t.token[0]);
        return t.token[0] - '0';
    }

    // Copy to a buffer so we can NUL-terminate it, as strto[idf]() expect.
    char buf[64];
    char *bufp = buf;
    std::unique_ptr<char[]> allocBuf;
    CHECK_RARE(1e-5, t.token.size() + 1 >= sizeof(buf));
    if (t.token.size() + 1 >= sizeof(buf)) {
        // This should be very unusual, but is necessary in case we get a
        // goofball number with lots of leading zeros, for example.
        allocBuf = std::make_unique<char[]>(t.token.size() + 1);
        bufp = allocBuf.get();
    }

    std::copy(t.token.begin(), t.token.end(), bufp);
    bufp[t.token.size()] = '\0';

    // Can we just use strtol?
    auto isInteger = [](std::string_view str) {
        for (char ch : str)
            if (!(ch >= '0' && ch <= '9'))
                return false;
        return true;
    };

    int length = 0;
    double val;
    if (isInteger(t.token)) {
        char *endptr;
        val = double(strtol(bufp, &endptr, 10));
        length = endptr - bufp;
    } else if (sizeof(Float) == sizeof(float))
        val = floatParser.StringToFloat(bufp, t.token.size(), &length);
    else
        val = floatParser.StringToDouble(bufp, t.token.size(), &length);

    if (length == 0)
        ErrorExit(&t.loc, "%s: expected a number", toString(t.token));

    return val;
}